

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

SN_ELEMENT * __thiscall ON_SerialNumberMap::LastElement(ON_SerialNumberMap *this)

{
  uint uVar1;
  ON_SN_BLOCK *pOVar2;
  SN_ELEMENT *pSVar3;
  ulong uVar4;
  SN_ELEMENT *pSVar5;
  SN_ELEMENT *pSVar6;
  long lVar7;
  ON__UINT64 OVar8;
  SN_ELEMENT *pSVar9;
  bool bVar10;
  
  pOVar2 = this->m_sn_block0;
  uVar4 = (ulong)pOVar2->m_purged;
  if (pOVar2->m_purged < pOVar2->m_count) {
    if (uVar4 != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      this->m_sn_count = this->m_sn_count - uVar4;
      this->m_sn_purged = this->m_sn_purged - uVar4;
      ON_SN_BLOCK::CullBlockHelper(pOVar2);
    }
    if (this->m_sn_block0->m_sorted == 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
    }
    pSVar6 = this->m_sn_block0->m_sn + (this->m_sn_block0->m_count - 1);
  }
  else {
    pSVar6 = (SN_ELEMENT *)0x0;
  }
  OVar8 = this->m_snblk_list_count;
  do {
    bVar10 = OVar8 == 0;
    OVar8 = OVar8 - 1;
    if (bVar10) {
      return pSVar6;
    }
    pOVar2 = this->m_snblk_list[OVar8];
    uVar1 = pOVar2->m_count;
  } while (uVar1 <= pOVar2->m_purged);
  if ((pSVar6 == (SN_ELEMENT *)0x0) || (pSVar5 = pSVar6, pSVar6->m_sn <= pOVar2->m_sn1)) {
    lVar7 = (ulong)uVar1 + 1;
    pSVar9 = pOVar2->m_sn + uVar1;
    do {
      lVar7 = lVar7 + -1;
      if (lVar7 == 0) {
        return pSVar6;
      }
      pSVar3 = pSVar9 + -1;
      pSVar5 = pSVar9 + -1;
      pSVar9 = pSVar9 + -1;
    } while (pSVar3->m_sn_active == '\0');
  }
  return pSVar5;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::LastElement() const
{
  struct SN_ELEMENT* e=0;
  ON__UINT64 i,j;

  // Last element is likely to be m_sn_block0.m_sn[m_sn_block0.m_count-1]
  // so start looking there.
  if ( m_sn_block0.m_count > m_sn_block0.m_purged )
  {
    if ( m_sn_block0.m_purged > 0 )
    {
      // remove purged elements from m_sn_block0

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
    }
    if ( !m_sn_block0.m_sorted )
    {
      // sort m_sn_block0
      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();      
    }
    e = const_cast<struct SN_ELEMENT*>(&m_sn_block0.m_sn[m_sn_block0.m_count-1]);
  }

  i = (ON__UINT64)m_snblk_list_count;
  while(i--)
  {
    if ( m_snblk_list[i]->m_count > m_snblk_list[i]->m_purged )
    {
      if (e && e->m_sn > m_snblk_list[i]->m_sn1 )
        break;
      j = m_snblk_list[i]->m_count;
      while(j--)
      {
        if ( m_snblk_list[i]->m_sn[j].m_sn_active )
        {
          e = &m_snblk_list[i]->m_sn[j];
          break;
        }
      }
      break;
    }
  }

  return e;
}